

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall
TPZBlockDiagonal<long_double>::AutoFill
          (TPZBlockDiagonal<long_double> *this,int64_t neq,int64_t jeq,int symmetric)

{
  long lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  int iVar7;
  long lVar8;
  longdouble *plVar9;
  longdouble *plVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  TPZManVector<int,_10> *blocksize;
  long lVar16;
  long lVar17;
  longdouble in_ST0;
  longdouble lVar18;
  longdouble in_ST1;
  longdouble lVar19;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  TPZStack<int,_10> blsizes;
  long local_a8;
  long local_a0;
  longdouble local_8c;
  TPZManVector<int,_10> local_78;
  
  if (neq == jeq) {
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
    if (0 < neq) {
      lVar13 = 0;
      do {
        iVar7 = rand();
        lVar11 = (iVar7 * neq) / 0x7fffffff;
        lVar8 = neq - lVar13;
        if (lVar11 < neq - lVar13) {
          lVar8 = lVar11;
        }
        TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,(int)lVar8);
        lVar13 = lVar13 + lVar8;
      } while (lVar13 < neq);
    }
    blocksize = &local_78;
    Initialize(this,&blocksize->super_TPZVec<int>);
    lVar13 = (this->fBlockSize).fNElements;
    if (0 < lVar13) {
      lVar11 = 0;
      do {
        lVar8 = (long)(this->fBlockSize).fStore[lVar11];
        if (0 < lVar8) {
          lVar1 = (this->fBlockPos).fStore[lVar11];
          local_a8 = lVar1 << 4;
          lVar16 = lVar8 * 0x10;
          lVar14 = 0;
          lVar15 = 0;
          local_a0 = local_a8;
          do {
            if (lVar15 == 0 || symmetric != 1) {
              lVar19 = (longdouble)0;
              lVar17 = 0;
            }
            else {
              plVar9 = (this->fStorage).fStore;
              plVar10 = plVar9 + lVar1;
              lVar12 = 0;
              lVar19 = (longdouble)0;
              do {
                lVar18 = *(longdouble *)((long)plVar9 + lVar12 + local_a8);
                *(longdouble *)((long)plVar10 + lVar14) = lVar18;
                lVar19 = ABS(lVar18) + lVar19;
                lVar12 = lVar12 + 0x10;
                plVar10 = plVar10 + lVar8;
                lVar17 = lVar15;
                in_ST5 = in_ST4;
                in_ST6 = in_ST4;
              } while (lVar14 != lVar12);
            }
            if (lVar17 < lVar8) {
              lVar12 = lVar16 * lVar17 + local_a0;
              lVar18 = in_ST0;
              lVar2 = in_ST1;
              lVar3 = in_ST2;
              lVar4 = in_ST3;
              lVar5 = in_ST4;
              lVar6 = in_ST5;
              in_ST5 = in_ST6;
              local_8c = lVar19;
              do {
                in_ST4 = lVar6;
                in_ST3 = lVar5;
                in_ST2 = lVar4;
                in_ST1 = lVar3;
                in_ST0 = lVar2;
                TPZMatrix<long_double>::GetRandomVal
                          ((longdouble *)this,(TPZMatrix<long_double> *)blocksize);
                plVar9 = (this->fStorage).fStore;
                *(longdouble *)((long)plVar9 + lVar12) = lVar18;
                lVar19 = ABS(lVar18) + local_8c;
                if (lVar15 == lVar17) {
                  lVar19 = local_8c;
                }
                lVar17 = lVar17 + 1;
                lVar12 = lVar12 + lVar16;
                lVar18 = in_ST0;
                lVar2 = in_ST1;
                lVar3 = in_ST2;
                lVar4 = in_ST3;
                lVar5 = in_ST4;
                lVar6 = in_ST5;
                local_8c = lVar19;
              } while (lVar8 != lVar17);
            }
            else {
              plVar9 = (this->fStorage).fStore;
            }
            if (ABS(plVar9[lVar1 + lVar15 + lVar15 * lVar8]) < lVar19) {
              plVar9[lVar1 + lVar15 + lVar15 * lVar8] = (longdouble)1 + lVar19;
            }
            lVar15 = lVar15 + 1;
            local_a8 = local_a8 + lVar16;
            lVar14 = lVar14 + 0x10;
            local_a0 = local_a0 + 0x10;
            in_ST6 = in_ST5;
          } while (lVar15 != lVar8);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar13);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.cpp"
             ,0x24f);
}

Assistant:

void TPZBlockDiagonal<TVar>::AutoFill(int64_t neq, int64_t jeq, int symmetric) {
    if (neq != jeq) {
        DebugStop();
    }
    TPZStack<int> blsizes;
    int64_t totalsize = 0;
    while (totalsize < neq) {
        int64_t blsize = (neq*rand())/RAND_MAX;
        blsize = blsize < neq-totalsize ? blsize : neq-totalsize;
        blsizes.Push(blsize);
        totalsize += blsize;
    }
    Initialize(blsizes);
    // Initialize the blocksizes!!
	int64_t b, bsize, eq = 0, pos;
	int64_t nb = fBlockSize.NElements(), r, c;
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(c=0; c<bsize; c++) {
            RTVar sum = 0.;
            r=0;
            if (symmetric == 1) {
                for (r=0; r<c; r++) {
                    fStorage[pos+c+r*bsize]=fStorage[pos+r+c*bsize];
                    sum += fabs(fStorage[pos+r+c*bsize]);
                }
            }
			for(; r<bsize; r++) {
				auto val = this->GetRandomVal();
				fStorage[pos+c+r*bsize] = (val);
                if(c!= r) sum += fabs(val);
			}
            //totototo
//            if(r==4)
//            {
//                std::cout << "sum " << sum << std::endl;
//            }
            if (fabs(fStorage[pos+c+c*bsize]) < sum) {
                fStorage[pos+c+c*bsize] = (TVar)(sum + (RTVar)1.);
            }
		}
		eq += bsize;
	}
}